

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

long dist2(Point *p,Point *q)

{
  long local_28;
  long dy;
  long dx;
  Point *q_local;
  Point *p_local;
  
  dy = p->x - q->x;
  if (dy < 0) {
    dy = -dy;
  }
  local_28 = p->y - q->y;
  if (local_28 < 0) {
    local_28 = -local_28;
  }
  return dy + local_28;
}

Assistant:

long  dist2(
  Point*  p,
  Point*  q
)
{
  long  dx, dy;
    
  dx = (p->x) - (q->x);
  if( dx < 0 )  dx = -dx;
  dy = (p->y) - (q->y);
  if( dy < 0 )  dy = -dy;

  return  dx + dy; 
}